

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triangulated_Surface.cpp
# Opt level: O0

void __thiscall
Nova::Triangulated_Surface<float>::Initialize_Cylinder_Tessellation
          (Triangulated_Surface<float> *this,Cylinder<float> *cylinder,int m,int n,bool create_caps)

{
  float fVar1;
  initializer_list<int> l;
  initializer_list<int> l_00;
  initializer_list<int> l_01;
  initializer_list<int> l_02;
  initializer_list<float> l_03;
  initializer_list<float> l_04;
  Cylinder<float> *pCVar2;
  size_t sVar3;
  double dVar4;
  int local_19c;
  int local_16c;
  int local_168;
  int local_164;
  iterator local_160;
  undefined8 local_158;
  Vector<int,_3,_true> local_150;
  int local_144;
  int local_140;
  int local_13c;
  iterator local_138;
  undefined8 local_130;
  Vector<int,_3,_true> local_128;
  int local_11c;
  int local_118;
  int local_114;
  iterator local_110;
  undefined8 local_108;
  Vector<int,_3,_true> local_100;
  int local_f4;
  int local_f0;
  int local_ec;
  iterator local_e8;
  undefined8 local_e0;
  Vector<int,_3,_true> local_d4;
  int local_c8;
  int local_c4;
  int i_1;
  int j_1;
  int j_2;
  undefined4 local_b4;
  iterator local_b0;
  undefined8 local_a8;
  Vector<float,_3,_true> local_9c;
  Vector<float,_3,_true> local_90;
  Vector<float,_3,_true> local_84;
  Vector<float,_3,_true> local_78;
  float local_6c;
  float local_68;
  float local_64;
  iterator local_60;
  undefined8 local_58;
  Vector<float,_3,_true> local_50;
  Vector<float,_3,_true> local_44;
  float local_38;
  int local_34;
  float theta;
  int j;
  int i;
  float dlength;
  float dtheta;
  int iStack_1c;
  bool create_caps_local;
  int n_local;
  int m_local;
  Cylinder<float> *cylinder_local;
  Triangulated_Surface<float> *this_local;
  
  dlength._3_1_ = create_caps;
  dtheta = (float)n;
  iStack_1c = m;
  _n_local = cylinder;
  cylinder_local = (Cylinder<float> *)this;
  Array<Nova::Vector<float,_3,_true>_>::Clear((Array<Nova::Vector<float,_3,_true>_> *)this);
  Array<Nova::Vector<int,_3,_true>_>::Clear(&(this->super_Simplex_Mesh<3>).elements);
  i = (int)((float)two_pi / (float)(int)dtheta);
  j = (int)(*(float *)_n_local / (float)(iStack_1c + -1));
  for (theta = 1.4013e-45; (int)theta <= iStack_1c; theta = (float)((int)theta + 1)) {
    for (local_34 = 1; local_34 <= (int)dtheta; local_34 = local_34 + 1) {
      local_38 = (float)(local_34 + -1) * (float)i;
      pCVar2 = _n_local + 0x14;
      local_6c = (float)j * (float)((int)theta + -1);
      fVar1 = *(float *)(_n_local + 4);
      dVar4 = sin((double)local_38);
      local_68 = fVar1 * (float)dVar4;
      fVar1 = *(float *)(_n_local + 4);
      dVar4 = cos((double)local_38);
      local_64 = fVar1 * (float)dVar4;
      local_60 = &local_6c;
      local_58 = 3;
      l_04._M_len = 3;
      l_04._M_array = local_60;
      Vector<float,_3,_true>::Vector(&local_50,l_04);
      Vector<float,_3,_true>::operator+(&local_44,(Vector<float,_3,_true> *)pCVar2);
      Point_Cloud<float,_3>::Add_Vertex(&this->super_Point_Cloud<float,_3>,&local_44);
    }
  }
  if ((dlength._3_1_ & 1) != 0) {
    pCVar2 = _n_local + 0x14;
    Vector<float,_3,_true>::Vector(&local_84);
    Vector<float,_3,_true>::operator+(&local_78,(Vector<float,_3,_true> *)pCVar2);
    Point_Cloud<float,_3>::Add_Vertex(&this->super_Point_Cloud<float,_3>,&local_78);
    pCVar2 = _n_local + 0x14;
    j_1 = *(int *)_n_local;
    j_2 = 0;
    local_b4 = 0;
    local_b0 = (iterator)&j_1;
    local_a8 = 3;
    l_03._M_len = 3;
    l_03._M_array = local_b0;
    Vector<float,_3,_true>::Vector(&local_9c,l_03);
    Vector<float,_3,_true>::operator+(&local_90,(Vector<float,_3,_true> *)pCVar2);
    Point_Cloud<float,_3>::Add_Vertex(&this->super_Point_Cloud<float,_3>,&local_90);
  }
  for (i_1 = 1; i_1 <= (int)dtheta; i_1 = i_1 + 1) {
    if ((float)i_1 == dtheta) {
      local_19c = 1;
    }
    else {
      local_19c = i_1 + 1;
    }
    local_c4 = local_19c;
    for (local_c8 = 1; local_c8 <= iStack_1c + -1; local_c8 = local_c8 + 1) {
      local_f4 = i_1 + (local_c8 + -1) * (int)dtheta + -1;
      local_f0 = i_1 + local_c8 * (int)dtheta + -1;
      local_ec = local_c4 + local_c8 * (int)dtheta + -1;
      local_e8 = &local_f4;
      local_e0 = 3;
      l_02._M_len = 3;
      l_02._M_array = local_e8;
      Vector<int,_3,_true>::Vector(&local_d4,l_02);
      Simplex_Mesh<3>::Add_Element(&this->super_Simplex_Mesh<3>,&local_d4);
      local_11c = i_1 + (local_c8 + -1) * (int)dtheta + -1;
      local_118 = local_c4 + local_c8 * (int)dtheta + -1;
      local_114 = local_c4 + (local_c8 + -1) * (int)dtheta + -1;
      local_110 = &local_11c;
      local_108 = 3;
      l_01._M_len = 3;
      l_01._M_array = local_110;
      Vector<int,_3,_true>::Vector(&local_100,l_01);
      Simplex_Mesh<3>::Add_Element(&this->super_Simplex_Mesh<3>,&local_100);
    }
    if ((dlength._3_1_ & 1) != 0) {
      local_144 = iStack_1c * (int)dtheta;
      local_140 = i_1 + -1;
      local_13c = local_c4 + -1;
      local_138 = &local_144;
      local_130 = 3;
      l_00._M_len = 3;
      l_00._M_array = local_138;
      Vector<int,_3,_true>::Vector(&local_128,l_00);
      Simplex_Mesh<3>::Add_Element(&this->super_Simplex_Mesh<3>,&local_128);
      local_16c = iStack_1c * (int)dtheta + 1;
      local_168 = local_c4 + (iStack_1c + -1) * (int)dtheta + -1;
      local_164 = i_1 + (iStack_1c + -1) * (int)dtheta + -1;
      local_160 = &local_16c;
      local_158 = 3;
      l._M_len = 3;
      l._M_array = local_160;
      Vector<int,_3,_true>::Vector(&local_150,l);
      Simplex_Mesh<3>::Add_Element(&this->super_Simplex_Mesh<3>,&local_150);
    }
  }
  sVar3 = Array<Nova::Vector<float,_3,_true>_>::size((Array<Nova::Vector<float,_3,_true>_> *)this);
  (this->super_Simplex_Mesh<3>).number_of_nodes = sVar3;
  return;
}

Assistant:

void Nova::Triangulated_Surface<T>::
Initialize_Cylinder_Tessellation(const Cylinder<T>& cylinder,const int m,const int n,const bool create_caps)
{
    points.Clear();elements.Clear();

    T dtheta=(T)two_pi/n,dlength=cylinder.height/(m-1);
    for(int i=1;i<=m;++i) for(int j=1;j<=n;++j){T theta=(j-1)*dtheta;
        Add_Vertex(cylinder.plane1.x1+TV({dlength*(i-1),cylinder.radius*(T)sin(theta),cylinder.radius*(T)cos(theta)}));}
    if(create_caps){Add_Vertex(cylinder.plane1.x1+TV());Add_Vertex(cylinder.plane1.x1+TV({cylinder.height,0,0}));}

    for(int j=1;j<=n;++j){int j_1=j==n?1:j+1;
        for(int i=1;i<=m-1;++i){
            Add_Element(INDEX({j+(i-1)*n-1,j+i*n-1,j_1+i*n-1}));
            Add_Element(INDEX({j+(i-1)*n-1,j_1+i*n-1,j_1+(i-1)*n-1}));}
        if(create_caps){
            Add_Element(INDEX({m*n,j-1,j_1-1}));
            Add_Element(INDEX({m*n+1,j_1+(m-1)*n-1,j+(m-1)*n-1}));}}
    number_of_nodes=points.size();
}